

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_NoTrainingInputs(void)

{
  NeuralNetwork *pNVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  FeatureDescription *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  reference from;
  ostream *poVar5;
  Result local_1f0;
  FeatureDescription *local_1c8;
  FeatureDescription *trainingInputModel;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInputTarget;
  Result local_160;
  set<long,_std::less<long>,_std::allocator<long>_> local_138;
  set<long,_std::less<long>,_std::allocator<long>_> local_108;
  set<long,_std::less<long>,_std::allocator<long>_> local_d8;
  NeuralNetwork *local_a0;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [8];
  Result res;
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_75a77;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_75a8e;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)((long)&res.m_message.field_2 + 8),true,
             (TensorAttributes *)&tensorAttributesOut.dimension,(TensorAttributes *)&neuralNet,0x400
             ,false,false);
  CoreML::Specification::Model::set_specificationversion
            ((Model *)((long)&res.m_message.field_2 + 8),4);
  local_a0 = CoreML::Specification::Model::mutable_neuralnetwork
                       ((Model *)((long)&res.m_message.field_2 + 8));
  addSoftmaxLayer((Model *)((long)&res.m_message.field_2 + 8),"softmax","OutTensor","softmax_out");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)((long)&res.m_message.field_2 + 8),local_a0,"cross_entropy_loss_layer",
             "softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (local_a0,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = local_a0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_d8._M_t._M_impl._0_8_ = 0;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_d8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar1,kSgdOptimizer,10,5,100,&local_d8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_d8);
  pNVar1 = local_a0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_108._M_t._M_impl._0_8_ = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_108);
  addEpochs<CoreML::Specification::NeuralNetwork>(pNVar1,100,1,100,&local_108);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_108);
  pNVar1 = local_a0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_138._M_t._M_impl._0_8_ = 0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_138);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>(pNVar1,0x7e3,0,0x7e3,&local_138);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_138);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar3);
  CoreML::Model::validate(&local_160,(Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::operator=((Result *)local_68,&local_160);
  CoreML::Result::~Result(&local_160);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x56f);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    pMVar3 = CoreML::Specification::Model::mutable_description
                       ((Model *)((long)&res.m_message.field_2 + 8));
    pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
    this = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (pRVar4);
    CoreML::Specification::FeatureDescription::set_name(this,"target");
    this_00 = CoreML::Specification::FeatureDescription::mutable_type(this);
    this_01 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_00);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (this_01,ArrayFeatureType_ArrayDataType_INT32);
    CoreML::Specification::ArrayFeatureType::add_shape(this_01,1);
    pMVar3 = CoreML::Specification::Model::description((Model *)((long)&res.m_message.field_2 + 8));
    pRVar4 = CoreML::Specification::ModelDescription::input(pMVar3);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar4);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar4);
    while( true ) {
      bVar2 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                        (&__end1,(iterator *)&feature._cached_size_);
      if (!bVar2) break;
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInputModel,from);
      pMVar3 = CoreML::Specification::Model::mutable_description
                         ((Model *)((long)&res.m_message.field_2 + 8));
      pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
      local_1c8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (pRVar4);
      CoreML::Specification::FeatureDescription::CopyFrom
                (local_1c8,(FeatureDescription *)&trainingInputModel);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInputModel);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
    }
    CoreML::Model::validate(&local_1f0,(Model *)((long)&res.m_message.field_2 + 8));
    CoreML::Result::operator=((Result *)local_68,&local_1f0);
    CoreML::Result::~Result(&local_1f0);
    bVar2 = CoreML::Result::good((Result *)local_68);
    if (bVar2) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57d);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,"(res).good()");
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)((long)&res.m_message.field_2 + 8));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_NoTrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", "target");


    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    spec.mutable_description()->clear_traininginput(); // Clearing all training inputs, buildBasicNeuralNetworkModel() adds model inputs to training inputs

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add target and model's inputs to training inputs
    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}